

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.cpp
# Opt level: O0

void * MESThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char local_7b8 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_5ac;
  int local_5a8;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  double dStack_550;
  BOOL bConnected;
  double distance;
  MES mes;
  void *pParam_local;
  
  dStack_550 = 0.0;
  chrono_period._68_4_ = 0;
  i = 100;
  local_5a8 = 0;
  mes._1328_8_ = pParam;
  memset(&distance,0,0x538);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPauseMES == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("MES paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectMES((MES *)&distance);
      }
      if (bExit != 0) goto LAB_001d0928;
      mSleep(100);
    }
    if (bRestartMES != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a MES.\n");
        chrono_period._68_4_ = 0;
        DisconnectMES((MES *)&distance);
      }
      bRestartMES = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectMES((MES *)&distance,"MES0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = mes.BaudRate;
        if (mes.RS232Port._784_8_ != 0) {
          fclose((FILE *)mes.RS232Port._784_8_);
          mes.RS232Port.DevType = 0;
          mes.RS232Port._788_4_ = 0;
        }
        if ((mes.timeout != 0) && (mes.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)&mes.LastDistance);
          if (sVar2 == 0) {
            sprintf(local_7b8,"mes");
          }
          else {
            sprintf(local_7b8,"%.127s",&mes.LastDistance);
          }
          sVar2 = strlen(local_7b8);
          local_5ac = (int)sVar2;
          do {
            local_5ac = local_5ac + -1;
            if (local_5ac < 0) break;
          } while (local_7b8[local_5ac] != '.');
          if ((0 < local_5ac) && (sVar2 = strlen(local_7b8), local_5ac < (int)sVar2)) {
            sVar2 = strlen(local_7b8);
            memset(local_7b8 + local_5ac,0,sVar2 - (long)local_5ac);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_7b8,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          mes.RS232Port._784_8_ = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)mes.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create MES data file.\n");
            goto LAB_001d0928;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetLatestDataMES((MES *)&distance,&stack0xfffffffffffffab0);
      if (iVar1 == 0) {
        EnterCriticalSection(&StateVariablesCS);
        altitude_AGL = dStack_550;
        LeaveCriticalSection(&StateVariablesCS);
      }
      else {
        printf("Connection to a MES lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectMES((MES *)&distance);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_5a8 = local_5a8 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_5a8)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001d0928:
      StopChronoQuick((CHRONO *)&errcount);
      if (mes.RS232Port._784_8_ != 0) {
        fclose((FILE *)mes.RS232Port._784_8_);
        mes.RS232Port.DevType = 0;
        mes.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectMES((MES *)&distance);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MESThread(void* pParam)
{
	MES mes;
	double distance = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&mes, 0, sizeof(MES));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMES)
		{
			if (bConnected)
			{
				printf("MES paused.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMES)
		{
			if (bConnected)
			{
				printf("Restarting a MES.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
			bRestartMES = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMES(&mes, "MES0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = mes.threadperiod;

				if (mes.pfSaveFile != NULL)
				{
					fclose(mes.pfSaveFile); 
					mes.pfSaveFile = NULL;
				}
				if ((mes.bSaveRawData)&&(mes.pfSaveFile == NULL)) 
				{
					if (strlen(mes.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", mes.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "mes");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					mes.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (mes.pfSaveFile == NULL) 
					{
						printf("Unable to create MES data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataMES(&mes, &distance) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				altitude_AGL = distance;

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a MES lost.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
		}

		//printf("MESThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (mes.pfSaveFile != NULL)
	{
		fclose(mes.pfSaveFile); 
		mes.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMES(&mes);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}